

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tests.h
# Opt level: O3

void density_tests::detail::
     PutRawBlocks<density::lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)0>>
     ::
     consume_impl<density::lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)0>::reentrant_consume_operation>
               (reentrant_consume_operation *i_consume)

{
  pointer ppcVar1;
  pointer ppcVar2;
  char *pcVar3;
  runtime_type<> *prVar4;
  Data *pDVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  
  prVar4 = density::
           lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
           ::reentrant_consume_operation::complete_type((reentrant_consume_operation *)i_consume);
  if (prVar4->m_feature_table !=
      (tuple_type *)
      density::detail::
      FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,density_tests::detail::PutRawBlocks<density::lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)0>>::Data>
      ::s_table) {
    assert_failed<>("i_consume.complete_type().template is<ElementType>()",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/generic_tests/queue_generic_tests.h"
                    ,0x198);
  }
  pDVar5 = density::
           lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)0>
           ::reentrant_consume_operation::
           element<density_tests::detail::PutRawBlocks<density::lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)0>>::Data>
                     ((reentrant_consume_operation *)i_consume);
  ppcVar1 = (pDVar5->m_blocks).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppcVar2 = (pDVar5->m_blocks).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  exception_checkpoint();
  if (ppcVar1 != ppcVar2) {
    lVar8 = (long)ppcVar1 - (long)ppcVar2 >> 3;
    lVar6 = 0;
    lVar9 = lVar8;
    do {
      pcVar3 = (pDVar5->m_blocks).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
               super__Vector_impl_data._M_start[lVar6];
      if (lVar8 - lVar6 != 0) {
        lVar7 = 0;
        do {
          if (((int)(lVar8 - lVar6) + (int)((ulong)(lVar8 - lVar6) / 10) * -10 | 0x30U) !=
              (int)pcVar3[lVar7]) {
            assert_failed<>("chars[i] == fill_char",
                            "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/generic_tests/queue_generic_tests.h"
                            ,0x1a6);
          }
          lVar7 = lVar7 + 1;
        } while (lVar9 + (ulong)(lVar9 == 0) != lVar7);
      }
      if (pcVar3[lVar8 - lVar6] != '\0') {
        assert_failed<>("chars[size] == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/generic_tests/queue_generic_tests.h"
                        ,0x1a8);
      }
      lVar6 = lVar6 + 1;
      lVar9 = lVar9 + -1;
    } while (lVar6 != lVar8 + (ulong)(lVar8 == 0));
  }
  return;
}

Assistant:

static void consume_impl(const CONSUME_OPERATION & i_consume)
            {
                DENSITY_TEST_ASSERT(i_consume.complete_type().template is<ElementType>());

                auto &     data  = i_consume.template element<ElementType>();
                auto const count = data.m_blocks.size();

                exception_checkpoint();

                for (size_t index = 0; index < count; index++)
                {
                    auto const size      = count - index;
                    auto const fill_char = static_cast<char>('0' + size % 10);
                    auto const chars     = data.m_blocks[index];
                    for (size_t i = 0; i < size; i++)
                    {
                        DENSITY_TEST_ASSERT(chars[i] == fill_char);
                    }
                    DENSITY_TEST_ASSERT(chars[size] == 0);
                }
            }